

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QMimeType>::emplace<QMimeType>
          (QMovableArrayOps<QMimeType> *this,qsizetype i,QMimeType *args)

{
  QMimeType **ppQVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  long lVar4;
  long in_FS_OFFSET;
  bool bVar5;
  QMimeType tmp;
  Inserter local_50;
  QMimeType local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<QMimeType>).super_QArrayDataPointer<QMimeType>.d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (__int_type_conflict)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_004b3de4:
    local_28.d.d.ptr = (QExplicitlySharedDataPointer<QMimeTypePrivate>)&DAT_aaaaaaaaaaaaaaaa;
    QMimeType::QMimeType(&local_28,args);
    bVar5 = (this->super_QGenericArrayOps<QMimeType>).super_QArrayDataPointer<QMimeType>.size != 0;
    QArrayDataPointer<QMimeType>::detachAndGrow
              ((QArrayDataPointer<QMimeType> *)this,(uint)(i == 0 && bVar5),1,(QMimeType **)0x0,
               (QArrayDataPointer<QMimeType> *)0x0);
    if (i == 0 && bVar5) {
      QMimeType::QMimeType
                ((this->super_QGenericArrayOps<QMimeType>).super_QArrayDataPointer<QMimeType>.ptr +
                 -1,&local_28);
      ppQVar1 = &(this->super_QGenericArrayOps<QMimeType>).super_QArrayDataPointer<QMimeType>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
      pqVar2 = &(this->super_QGenericArrayOps<QMimeType>).super_QArrayDataPointer<QMimeType>.size;
      *pqVar2 = *pqVar2 + 1;
    }
    else {
      local_50.displaceTo =
           (this->super_QGenericArrayOps<QMimeType>).super_QArrayDataPointer<QMimeType>.ptr;
      local_50.displaceFrom = local_50.displaceTo + i;
      local_50.displaceTo = local_50.displaceTo + i + 1;
      local_50.nInserts = 1;
      local_50.bytes =
           ((this->super_QGenericArrayOps<QMimeType>).super_QArrayDataPointer<QMimeType>.size - i) *
           8;
      local_50.data = (QArrayDataPointer<QMimeType> *)this;
      memmove(local_50.displaceTo,local_50.displaceFrom,local_50.bytes);
      QMimeType::QMimeType(local_50.displaceFrom,&local_28);
      local_50.displaceFrom = local_50.displaceFrom + 1;
      Inserter::~Inserter(&local_50);
    }
    QMimeType::~QMimeType(&local_28);
  }
  else {
    lVar4 = (this->super_QGenericArrayOps<QMimeType>).super_QArrayDataPointer<QMimeType>.size;
    if ((lVar4 == i && pDVar3 != (Data *)0x0) &&
       ((pDVar3->super_QArrayData).alloc !=
        ((long)((long)(this->super_QGenericArrayOps<QMimeType>).super_QArrayDataPointer<QMimeType>.
                      ptr -
               ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) +
        lVar4)) {
      QMimeType::QMimeType
                ((this->super_QGenericArrayOps<QMimeType>).super_QArrayDataPointer<QMimeType>.ptr +
                 lVar4,args);
    }
    else {
      if (((i != 0) || (pDVar3 == (Data *)0x0)) ||
         ((QMimeType *)((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)
          == (this->super_QGenericArrayOps<QMimeType>).super_QArrayDataPointer<QMimeType>.ptr))
      goto LAB_004b3de4;
      QMimeType::QMimeType
                ((this->super_QGenericArrayOps<QMimeType>).super_QArrayDataPointer<QMimeType>.ptr +
                 -1,args);
      ppQVar1 = &(this->super_QGenericArrayOps<QMimeType>).super_QArrayDataPointer<QMimeType>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    pqVar2 = &(this->super_QGenericArrayOps<QMimeType>).super_QArrayDataPointer<QMimeType>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }